

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::ArrayEmptyExpr::toString_abi_cxx11_(string *__return_storage_ptr__,ArrayEmptyExpr *this)

{
  pointer pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ArrayEmptyExpr *local_18;
  ArrayEmptyExpr *this_local;
  
  local_18 = this;
  this_local = (ArrayEmptyExpr *)__return_storage_ptr__;
  pEVar1 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                     (&this->typeExpr);
  (*pEVar1->_vptr_Expr[2])();
  std::operator+(&local_38,'[',&local_58);
  std::operator+(__return_storage_ptr__,&local_38,']');
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string ArrayEmptyExpr::toString() const noexcept {
  return '[' + typeExpr->toString() + ']';
}